

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

bool __thiscall QPDF::resolveXRefTable(QPDF *this)

{
  bool bVar1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  QPDFObjGen og;
  QPDFObjGen og_00;
  bool bVar3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  
  _Var2._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  bVar1 = (_Var2._M_head_impl)->reconstructed_xref;
  p_Var5 = (_Rb_tree_node_base *)((long)&(_Var2._M_head_impl)->xref_table + 8);
  for (p_Var4 = *(_Base_ptr *)((long)&(_Var2._M_head_impl)->xref_table + 0x18); p_Var4 != p_Var5;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    og.obj = p_Var4[1]._M_color;
    og.gen = *(int *)&p_Var4[1].field_0x4;
    bVar3 = isUnresolved(this,og);
    if (bVar3) {
      og_00.obj = p_Var4[1]._M_color;
      og_00.gen = *(int *)&p_Var4[1].field_0x4;
      resolve(this,og_00);
      if ((bVar1 == false) &&
         (((this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->reconstructed_xref != false)
         ) break;
    }
  }
  return p_Var4 == p_Var5;
}

Assistant:

bool
QPDF::resolveXRefTable()
{
    bool may_change = !m->reconstructed_xref;
    for (auto& iter: m->xref_table) {
        if (isUnresolved(iter.first)) {
            resolve(iter.first);
            if (may_change && m->reconstructed_xref) {
                return false;
            }
        }
    }
    return true;
}